

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

bool IsValidRealNumber(wchar_t *wsz,int length)

{
  wchar_t __wc;
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  int local_48;
  int local_44;
  
  if (length == 0) {
    bVar2 = false;
  }
  else {
    bVar6 = 0 < length;
    if (length < 1) {
      bVar2 = true;
    }
    else {
      bVar4 = true;
      bVar1 = false;
      bVar2 = false;
      local_48 = 0;
      local_44 = 0;
      uVar5 = 1;
      do {
        __wc = wsz[uVar5 - 1];
        iVar3 = iswspace(__wc);
        if (iVar3 == 0) {
          if ((__wc & 0xfffffffdU) == 0x2c) {
            local_44 = local_44 + 1;
          }
          else if ((__wc & 0xffffffdfU) == 0x45) {
            local_48 = local_48 + 1;
          }
          else {
            iVar3 = iswdigit(__wc);
            if (((iVar3 == 0) && (__wc != L'-')) && (bVar7 = true, __wc != L'+')) goto LAB_006856ea;
          }
          bVar7 = bVar2;
          if (!bVar2) {
            bVar4 = false;
          }
        }
        else {
          bVar2 = bVar1;
          if (!bVar4) {
            bVar2 = true;
          }
          bVar7 = false;
          bVar1 = bVar2;
        }
LAB_006856ea:
        if (bVar7) break;
        bVar6 = uVar5 < (uint)length;
        bVar7 = uVar5 != (uint)length;
        uVar5 = uVar5 + 1;
      } while (bVar7);
      bVar2 = local_48 < 2 && local_44 < 2;
    }
    bVar2 = (bool)((bVar6 ^ 1U) & bVar2);
  }
  return bVar2;
}

Assistant:

static bool IsValidRealNumber(const wchar_t* wsz, int length)
{
  if (length == 0)
    return false;

  int puncCount = 0;
  int eCount = 0;

  bool bAtStart = true;
  bool bAtEnd = false;

  for (int i = 0; i < length; i++)
  {
    const auto w = wsz[i];

    // Skip past whitespace at the start of the string.
    if (iswspace(w))
    {
      if (bAtStart)
      {
        // Skip past white space at the beginning of string.
        continue;
      }
      else
      {
        // Otherwise, whitespace can only appear at the end of the string.
        bAtEnd = true;
        continue;
      }
    }

    if (w == L'.' || w == L',') puncCount++;
    else
    if (w == L'e' || w == L'E') eCount++;
    else
    if (!iswdigit(w) && (w != L'-') && (w != L'+'))
      return false;

    // Nothing can come after spaces at the end.
    if (bAtEnd)
      return false;

    bAtStart = false;
  }

  if ((puncCount > 1) || (eCount > 1))
    return false;

  return true;
}